

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O2

QDataStream *
QtPrivate::readAssociativeContainer<QHash<QString,QVariant>>
          (QDataStream *s,QHash<QString,_QVariant> *c)

{
  Status SVar1;
  qint64 qVar2;
  QDataStream *s_00;
  long lVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_88;
  undefined1 local_68 [16];
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  StreamStateSaver::StreamStateSaver((StreamStateSaver *)local_68,s);
  QHash<QString,_QVariant>::clear(c);
  qVar2 = QDataStream::readQSizeType(s);
  if (qVar2 < 0) {
    QDataStream::setStatus(s,SizeLimitExceeded);
  }
  else {
    lVar3 = qVar2 + 1;
    do {
      lVar3 = lVar3 + -1;
      if (lVar3 == 0) break;
      local_88.d = (Data *)0x0;
      local_88.ptr = (char16_t *)0x0;
      local_88.size = 0;
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = 0;
      local_58._16_8_ = 0;
      local_40 = 2;
      s_00 = ::operator>>(s,(QString *)&local_88);
      ::operator>>(s_00,(QVariant *)&local_58);
      SVar1 = QDataStream::status(s);
      if (SVar1 == Ok) {
        QHash<QString,QVariant>::emplace<QVariant_const&>
                  ((QHash<QString,QVariant> *)c,(QString *)&local_88,(QVariant *)&local_58);
      }
      else {
        QHash<QString,_QVariant>::clear(c);
      }
      ::QVariant::~QVariant((QVariant *)&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    } while (SVar1 == Ok);
  }
  StreamStateSaver::~StreamStateSaver((StreamStateSaver *)local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return s;
}

Assistant:

QDataStream &readAssociativeContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::key_type k;
        typename Container::mapped_type t;
        s >> k >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.insert(k, t);
    }

    return s;
}